

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkSubpassDescriptionDepthStencilResolve *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  bool bVar1;
  GenericStringRef<char> local_90;
  uint local_7c;
  undefined1 local_78 [8];
  Value att;
  GenericStringRef<char> local_58;
  GenericStringRef<char> local_48;
  undefined1 local_38 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkSubpassDescriptionDepthStencilResolve *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_48,(char (*) [6])"sType");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_48,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<17u>
            (&local_58,(char (*) [17])"depthResolveMode");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkResolveModeFlagBits>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_58,create_info->depthResolveMode,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<19u>
            ((GenericStringRef<char> *)((long)&att.data_ + 8),(char (*) [19])"stencilResolveMode");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkResolveModeFlagBits>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(StringRefType *)((long)&att.data_ + 8),create_info->stencilResolveMode,
             alloc);
  if (create_info->pDepthStencilResolveAttachment != (VkAttachmentReference2 *)0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_78);
    bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (create_info->pDepthStencilResolveAttachment,alloc,(Value *)local_78);
    if (bVar1) {
      rapidjson::GenericStringRef<char>::GenericStringRef<30u>
                (&local_90,(char (*) [30])"depthStencilResolveAttachment");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_38,&local_90,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_78,alloc);
    }
    else {
      create_info_local._7_1_ = 0;
    }
    local_7c = (uint)!bVar1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_78);
    if (local_7c != 0) goto LAB_0013fd44;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38);
  create_info_local._7_1_ = 1;
  local_7c = 1;
LAB_0013fd44:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return (bool)(create_info_local._7_1_ & 1);
}

Assistant:

static bool json_value(const VkSubpassDescriptionDepthStencilResolve &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("depthResolveMode", create_info.depthResolveMode, alloc);
	value.AddMember("stencilResolveMode", create_info.stencilResolveMode, alloc);
	if (create_info.pDepthStencilResolveAttachment)
	{
		Value att;
		if (!json_value(*create_info.pDepthStencilResolveAttachment, alloc, &att))
			return false;
		value.AddMember("depthStencilResolveAttachment", att, alloc);
	}
	*out_value = value;
	return true;
}